

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

string * __thiscall
PhyloTree::getNewick_abi_cxx11_(string *__return_storage_ptr__,PhyloTree *this,bool branchLengths)

{
  pointer pcVar1;
  double d;
  undefined8 uVar2;
  PhyloTree *pPVar3;
  pointer pPVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  pointer pbVar9;
  size_t sVar10;
  int __flags;
  size_type *in_RCX;
  _Elt_pointer pbVar11;
  size_type *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _func_int **pp_Var14;
  undefined7 in_register_00000011;
  void *__child_stack;
  ulong uVar15;
  string *psVar16;
  ulong uVar17;
  _Elt_pointer pPVar18;
  PhyloTreeEdge *other;
  pointer pbVar19;
  Tools *pTVar20;
  void *in_R8;
  size_t i;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesLeft;
  Bipartition allLeaves;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> corrEdges;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strPieces;
  string local_298;
  string *local_278;
  undefined4 local_26c;
  PhyloTree *local_268;
  undefined1 local_260 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_210;
  string local_1f8;
  PhyloTreeEdge local_1d8;
  _func_int **local_190;
  _Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_188;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_e0;
  string local_c0;
  string local_a0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  local_26c = (undefined4)CONCAT71(in_register_00000011,branchLengths);
  local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_138,0);
  local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_initialize_map(&local_188,0);
  local_278 = __return_storage_ptr__;
  local_268 = this;
  if ((this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [2])0x134f56);
    pbVar19 = (this->leaf2NumMap).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pbVar9 - (long)pbVar19 != 0x20) {
      lVar23 = 0;
      uVar21 = 0;
      do {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_138,(value_type *)((long)&(pbVar19->_M_dataplus)._M_p + lVar23));
        if ((char)local_26c != '\0') {
          pTVar20 = (Tools *)0x134f09;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[2]>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                     (char (*) [2])0x134f09);
          Tools::double_to_string_abi_cxx11_
                    ((string *)&local_1d8,pTVar20,
                     (local_268->leafEdgeLengths).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21]);
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8
                    );
          if (local_1d8.super_Bipartition._vptr_Bipartition !=
              (_func_int **)
              ((long)&local_1d8.super_Bipartition.partition.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8U
              )) {
            operator_delete(local_1d8.super_Bipartition._vptr_Bipartition);
          }
        }
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   (char (*) [2])",");
        uVar21 = uVar21 + 1;
        pbVar19 = (local_268->leaf2NumMap).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 = (local_268->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar23 = lVar23 + 0x20;
      } while (uVar21 < ((long)pbVar9 - (long)pbVar19 >> 5) - 1U);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138,pbVar9 + -1);
    pPVar3 = local_268;
    pTVar20 = (Tools *)0x134f09;
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [2])0x134f09);
    Tools::double_to_string_abi_cxx11_
              ((string *)&local_1d8,pTVar20,
               (pPVar3->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_finish[-1]);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
    if (local_1d8.super_Bipartition._vptr_Bipartition !=
        (_func_int **)
        ((long)&local_1d8.super_Bipartition.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8U)) {
      operator_delete(local_1d8.super_Bipartition._vptr_Bipartition);
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               (char (*) [3])0x135841);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::deque(&local_80,
            (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    Tools::string_join(local_278,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&local_80);
    psVar16 = local_278;
  }
  else {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_210,&this->edges);
    if (local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&PTR_toString_abi_cxx11__00141b00;
      local_190 = (_func_int **)&PTR_toString_abi_cxx11__001419d0;
      do {
        PhyloTreeEdge::PhyloTreeEdge
                  (&local_1d8,
                   local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        __flags = (int)in_RCX;
        if ((ulong)(((long)local_210.
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_210.
                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2) {
          uVar21 = 0;
        }
        else {
          uVar15 = 1;
          lVar23 = 0x48;
          uVar21 = 0;
          do {
            bVar5 = Bipartition::contains
                              (&local_1d8.super_Bipartition,
                               (Bipartition *)
                               ((long)&((local_210.
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar23));
            pPVar4 = local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (bVar5) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&local_1d8.super_Bipartition.partition.m_bits,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&((local_210.
                                   super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                                 partition.m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar23));
              local_1d8.super_Bipartition.partition.m_num_bits =
                   *(size_type *)((long)&(pPVar4->super_Bipartition).partition.m_num_bits + lVar23);
              local_1d8.length = *(double *)((long)&pPVar4->length + lVar23);
              local_1d8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = *(element_type **)
                        ((long)&(pPVar4->originalEdge).
                                super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        lVar23);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_1d8.originalEdge.
                          super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(pPVar4->originalEdge).
                                 super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + lVar23));
              local_1d8.originalID = *(int *)((long)&pPVar4->originalID + lVar23);
              uVar21 = uVar15;
            }
            __flags = (int)in_RCX;
            uVar15 = uVar15 + 1;
            lVar23 = lVar23 + 0x48;
          } while (uVar15 < (ulong)(((long)local_210.
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_210.
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x71c71c71c71c71c7));
        }
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
                  (&local_210,
                   local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar21);
        PhyloTreeEdge::clone
                  ((PhyloTreeEdge *)local_260,(__fn *)&local_1d8,__child_stack,__flags,in_R8);
        __return_storage_ptr__ = local_278;
        std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_front<PhyloTreeEdge>
                  ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        local_260._0_8_ = local_218;
        if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
        }
        local_260._0_8_ = local_190;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (local_260 + 8));
        if (!bVar5) goto LAB_001220dc;
        if ((pointer)local_260._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_260._8_8_);
        }
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_front<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_);
        }
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"(","");
        uVar21 = 1;
        while (uVar21 < ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                        -0x71c71c71c71c71c7 +
                        ((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                        -0x71c71c71c71c71c7 +
                        (((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_188._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1
                        + (ulong)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                 (_Map_pointer)0x0)) * 7) {
          uVar15 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
                   -0x71c71c71c71c71c7 + uVar21;
          if (uVar15 < 7) {
            pPVar18 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur + uVar21;
          }
          else {
            if ((long)uVar15 < 1) {
              uVar17 = ~(~uVar15 / 7);
            }
            else {
              uVar17 = uVar15 / 7;
            }
            pPVar18 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                      uVar17 * -7 + uVar15;
          }
          bVar5 = Bipartition::contains(&local_1d8.super_Bipartition,&pPVar18->super_Bipartition);
          if (bVar5) {
            uVar15 = ((long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_138._M_impl.super__Deque_impl_data._M_start._M_first >> 5) +
                     uVar21;
            if (uVar15 < 0x10) {
              pbVar11 = local_138._M_impl.super__Deque_impl_data._M_start._M_cur + uVar21;
            }
            else {
              uVar17 = uVar15 >> 4 | 0xf000000000000000;
              if (0 < (long)uVar15) {
                uVar17 = uVar15 >> 4;
              }
              pbVar11 = local_138._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                        uVar15 + uVar17 * -0x10;
            }
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            pcVar1 = (pbVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,pcVar1,pcVar1 + pbVar11->_M_string_length);
            std::__cxx11::string::append((char *)&local_298);
            std::__cxx11::string::_M_append((char *)local_260,(ulong)local_298._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            uVar15 = ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
                     -0x71c71c71c71c71c7 + uVar21;
            if (uVar15 < 7) {
              pPVar18 = local_188._M_impl.super__Deque_impl_data._M_start._M_cur + uVar21;
            }
            else {
              if ((long)uVar15 < 1) {
                uVar17 = ~(~uVar15 / 7);
              }
              else {
                uVar17 = uVar15 / 7;
              }
              pPVar18 = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                        uVar17 * -7 + uVar15;
            }
            Bipartition::andNot(&local_1d8.super_Bipartition,&pPVar18->super_Bipartition);
            Tools::deque_remove_element_at_index<std::__cxx11::string>
                      ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_138,uVar21);
            Tools::deque_remove_element_at_index<PhyloTreeEdge>
                      ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188,uVar21);
          }
          else {
            uVar21 = uVar21 + 1;
          }
        }
        Bipartition::getPartition
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                   &local_1d8.super_Bipartition);
        uVar2 = local_298.field_2._8_8_;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_298);
        if (!bVar5) goto LAB_001220dc;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if (uVar2 != 0) {
          lVar23 = 8;
          uVar21 = 0;
          while( true ) {
            Bipartition::getPartition
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                       &local_1d8.super_Bipartition);
            uVar2 = local_298.field_2._8_8_;
            bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_298);
            if (!bVar5) goto LAB_001220dc;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            __return_storage_ptr__ = local_278;
            if ((ulong)uVar2 <= uVar21) break;
            Bipartition::getPartition
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,
                       &local_1d8.super_Bipartition);
            uVar15 = *(ulong *)(local_298._M_dataplus._M_p + (uVar21 >> 6) * 8);
            bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_298);
            if (!bVar5) goto LAB_001220dc;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            if ((1L << ((byte)uVar21 & 0x3f) & uVar15) != 0) {
              pTVar20 = *(Tools **)
                         ((long)(local_268->leaf2NumMap).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8);
              std::__cxx11::string::_M_append(local_260,(ulong)pTVar20);
              if ((char)local_26c != '\0') {
                Tools::double_to_string_abi_cxx11_
                          (&local_1f8,pTVar20,
                           (local_268->leafEdgeLengths).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar21]);
                in_R8 = (void *)0x1;
                plVar6 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1f8,0,(char *)0x0,0x134f09);
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                psVar12 = (size_type *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_298.field_2._M_allocated_capacity = *psVar12;
                  local_298.field_2._8_8_ = plVar6[3];
                }
                else {
                  local_298.field_2._M_allocated_capacity = *psVar12;
                  local_298._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_298._M_string_length = plVar6[1];
                *plVar6 = (long)psVar12;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                std::__cxx11::string::_M_append(local_260,(ulong)local_298._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p);
                }
              }
              std::__cxx11::string::append(local_260);
            }
            uVar21 = uVar21 + 1;
            lVar23 = lVar23 + 0x20;
          }
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_260._0_8_,(pointer)(local_260._8_8_ + local_260._0_8_))
        ;
        Tools::substring(&local_1f8,&local_e0,0,local_260._8_8_ - 1);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
        in_RCX = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_RCX) {
          local_298.field_2._M_allocated_capacity = *in_RCX;
          local_298.field_2._8_8_ = puVar7[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *in_RCX;
          local_298._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_298._M_string_length = puVar7[1];
        *puVar7 = in_RCX;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        psVar16 = &local_298;
        std::__cxx11::string::operator=((string *)local_260,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if ((char)local_26c != '\0') {
          d = PhyloTreeEdge::getLength(&local_1d8);
          Tools::double_to_string_abi_cxx11_(&local_1f8,(Tools *)psVar16,d);
          in_R8 = (void *)0x1;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x134f09);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          in_RCX = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_RCX) {
            local_298.field_2._M_allocated_capacity = *in_RCX;
            local_298.field_2._8_8_ = puVar7[3];
          }
          else {
            local_298.field_2._M_allocated_capacity = *in_RCX;
            local_298._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_298._M_string_length = puVar7[1];
          *puVar7 = in_RCX;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_260,(ulong)local_298._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_138,(value_type *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_);
        }
        local_1d8.super_Bipartition._vptr_Bipartition = (_func_int **)local_218;
        if (local_1d8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d8.originalEdge.
                     super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        local_1d8.super_Bipartition._vptr_Bipartition = local_190;
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_1d8.super_Bipartition.partition);
        if (!bVar5) goto LAB_001220dc;
        if (local_1d8.super_Bipartition.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d8.super_Bipartition.partition.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_210.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct
              ((ulong)local_260,
               (char)((long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5));
    Bipartition::Bipartition(&local_1d8.super_Bipartition,(string *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_);
    }
    local_218 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    lVar23 = -1;
    lVar22 = 0;
    lVar24 = 0;
    for (uVar21 = 0;
        uVar21 < ((long)local_188._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                 -0x71c71c71c71c71c7 +
                 ((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)local_188._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                 -0x71c71c71c71c71c7 +
                 (((long)local_188._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_188._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(local_188._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 7; uVar21 = uVar21 + 1) {
      lVar8 = (long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_138._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
      uVar15 = uVar21 + lVar8;
      if (uVar15 < 0x10) {
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&((local_138._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus).
                          _M_p + lVar24);
      }
      else {
        uVar17 = uVar15 >> 4 | 0xf000000000000000;
        if (0 < (long)uVar15) {
          uVar17 = uVar15 >> 4;
        }
        pbVar13 = local_138._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                  lVar8 + uVar17 * -0x10 + uVar21;
      }
      local_260._0_8_ = local_260 + 0x10;
      pcVar1 = (pbVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_260,pcVar1,pcVar1 + pbVar13->_M_string_length);
      std::__cxx11::string::append((char *)local_260);
      std::__cxx11::string::_M_append((char *)local_278,local_260._0_8_);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_);
      }
      lVar8 = (long)local_188._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_188._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar15 = uVar21 + lVar8 * -0x71c71c71c71c71c7;
      if (uVar15 < 7) {
        other = (PhyloTreeEdge *)
                ((long)&((local_188._M_impl.super__Deque_impl_data._M_start._M_cur)->
                        super_Bipartition)._vptr_Bipartition + lVar22);
      }
      else {
        if ((long)uVar15 < 1) {
          uVar17 = ~((ulong)(lVar23 + lVar8 * 0x71c71c71c71c71c7) / 7);
        }
        else {
          uVar17 = uVar15 / 7;
        }
        other = local_188._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                uVar17 * -7 + uVar15;
      }
      Bipartition::andNot(&local_1d8.super_Bipartition,&other->super_Bipartition);
      lVar24 = lVar24 + 0x20;
      lVar23 = lVar23 + -1;
      lVar22 = lVar22 + 0x48;
    }
    bVar5 = Bipartition::isEmpty(&local_1d8.super_Bipartition);
    if (!bVar5) {
      lVar23 = 8;
      for (uVar21 = 0; sVar10 = Bipartition::size(&local_1d8.super_Bipartition), uVar21 < sVar10;
          uVar21 = uVar21 + 1) {
        Bipartition::getPartition
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_260,
                   &local_1d8.super_Bipartition);
        uVar15 = *(ulong *)(local_260._0_8_ + (uVar21 >> 6) * 8);
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_260);
        if (!bVar5) goto LAB_001220dc;
        if ((_func_int **)local_260._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_260._0_8_);
        }
        if ((1L << ((byte)uVar21 & 0x3f) & uVar15) != 0) {
          pTVar20 = *(Tools **)
                     ((long)(local_268->leaf2NumMap).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8);
          std::__cxx11::string::_M_append((char *)local_278,(ulong)pTVar20);
          if ((char)local_26c != '\0') {
            Tools::double_to_string_abi_cxx11_
                      (&local_298,pTVar20,
                       (local_268->leafEdgeLengths).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21]);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x134f09);
            local_260._0_8_ = local_260 + 0x10;
            pp_Var14 = (_func_int **)(puVar7 + 2);
            if ((_func_int **)*puVar7 == pp_Var14) {
              local_260._16_8_ = *pp_Var14;
              local_260._24_8_ = puVar7[3];
            }
            else {
              local_260._16_8_ = *pp_Var14;
              local_260._0_8_ = (_func_int **)*puVar7;
            }
            local_260._8_8_ = puVar7[1];
            *puVar7 = pp_Var14;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_278,local_260._0_8_);
            if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
              operator_delete((void *)local_260._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
          }
          std::__cxx11::string::append((char *)local_278);
        }
        lVar23 = lVar23 + 0x20;
      }
    }
    psVar16 = local_278;
    pcVar1 = (local_278->_M_dataplus)._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar1,pcVar1 + local_278->_M_string_length);
    Tools::substring(&local_298,&local_c0,0,psVar16->_M_string_length - 1);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    pp_Var14 = (_func_int **)(plVar6 + 2);
    if ((_func_int **)*plVar6 == pp_Var14) {
      local_260._16_8_ = *pp_Var14;
      local_260._24_8_ = plVar6[3];
      local_260._0_8_ = local_260 + 0x10;
    }
    else {
      local_260._16_8_ = *pp_Var14;
      local_260._0_8_ = (_func_int **)*plVar6;
    }
    local_260._8_8_ = plVar6[1];
    *plVar6 = (long)pp_Var14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_278,(string *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_1d8.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001419d0;
    bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_1d8.super_Bipartition.partition);
    psVar16 = local_278;
    if (!bVar5) {
LAB_001220dc:
      __assert_fail("m_check_invariants()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x279,
                    "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (local_1d8.super_Bipartition.partition.m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super_Bipartition.partition.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_210);
  }
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque
            ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)&local_188);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_138);
  return psVar16;
}

Assistant:

string PhyloTree::getNewick(bool branchLengths) {
    deque<string> strPieces;
    deque<PhyloTreeEdge> corrEdges;

    if (edges.empty()) // star-tree
    {
        strPieces.emplace_back("(");
        for (size_t i = 0; i < leaf2NumMap.size() - 1; ++i) {
            strPieces.push_back(leaf2NumMap[i]);
            if (branchLengths) {
                strPieces.emplace_back(":");
                strPieces.push_back(Tools::double_to_string(leafEdgeLengths[i]));
            }
            strPieces.emplace_back(",");
        }
        strPieces.push_back(leaf2NumMap.back());
        strPieces.emplace_back(":");
        strPieces.push_back(Tools::double_to_string(leafEdgeLengths.back()));
        strPieces.emplace_back(");");
        return Tools::string_join(strPieces, "");
    }

    vector<PhyloTreeEdge> edgesLeft(edges);

    while (!edgesLeft.empty()) {
        auto minEdge = edgesLeft.front();
        size_t pos = 0;
        for (size_t i = 1; i < edgesLeft.size(); ++i) {
            if (minEdge.contains(edgesLeft[i])) {
                minEdge = edgesLeft[i];
                pos = i;
            }
        }
        Tools::vector_remove_element_at_index(edgesLeft, pos);

        corrEdges.push_front(minEdge.clone());
        strPieces.push_front("");

        // now we have a min element.
        // Start its Newick string.
        string str1 = "(";

        // Since we are allowing degenerate trees, there could be an arbitrary number of such edges.
        size_t k = 1;
        while (k < corrEdges.size()) {
            if (minEdge.contains(corrEdges[k])) {
                // add it to the string
                str1 += strPieces[k] + ",";

                // remove each leaf in this split from minEdge
                minEdge.andNot(corrEdges[k]);

                // remove this split and its corresponding string from the vectors
                Tools::deque_remove_element_at_index(strPieces, k);
                Tools::deque_remove_element_at_index(corrEdges, k);
            } else {
                k++;
            }
        }

        // add all the elements still in minEdge (These are leaves that weren't already added as part of
        // a min split contained by minEdge.)
        if (!minEdge.getPartition().empty()) {
            for (size_t i = 0; i < minEdge.getPartition().size(); i++) {
                if (minEdge.getPartition()[i]) {
                    str1 += leaf2NumMap[i];
                    if (branchLengths) {
                        str1 += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                    }
                    str1 += ",";
                }
            }
        }
        // remove the last , and add the bracket and minEdge length
        str1 = Tools::substring(str1, 0, str1.length() - 1) + ")";
        if (branchLengths) {
            str1 += ":" + Tools::double_to_string(minEdge.getLength());
        }
        // store str1
        strPieces.push_front(str1);
    }

    // now we need to combine all edges in corrEdges and all remaining leaves
    Bipartition allLeaves = Bipartition(string(leaf2NumMap.size(), '1'));

    string newickString = "(";
    // add all the string pieces we've accumulated
    for (int i = 0; i < corrEdges.size(); i++) {
        newickString += strPieces[i] + ",";
        allLeaves.andNot(corrEdges[i]);
    }
    // add all remaining leaves
    if (!allLeaves.isEmpty()) {
        for (size_t i = 0; i < allLeaves.size(); i++) {
            if ((allLeaves.getPartition())[i]) {
                newickString += leaf2NumMap[i];
                if (branchLengths) {
                    newickString += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                }
                newickString += ",";
            }
        }
    }

    // remove the last ,
    newickString = Tools::substring(newickString, 0, newickString.length() - 1) + ");";
    return newickString;
}